

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp9d_vdpu382.c
# Opt level: O0

MPP_RET hal_vp9d_vdpu382_reset(void *hal)

{
  long lVar1;
  Vdpu382Vp9dCtx *hw_ctx;
  HalVp9dCtx *p_hal;
  void *hal_local;
  
  lVar1 = *(long *)((long)hal + 0x40);
  if ((hal_vp9d_debug & 1) != 0) {
    _mpp_log_l(4,"hal_vp9d_vdpu382","(%d) enter\n","hal_vp9d_vdpu382_reset",0x428);
  }
  memset((void *)(lVar1 + 0xf8),0,100);
  *(undefined4 *)(lVar1 + 0xf0) = 0xffffffff;
  *(undefined4 *)(lVar1 + 0xf4) = 0xffffffff;
  *(undefined4 *)(lVar1 + 0x15c) = 1;
  memset((void *)(lVar1 + 0x238),0,0x10);
  *(undefined4 *)(lVar1 + 0x248) = 0;
  *(undefined4 *)(lVar1 + 0x24c) = 0;
  if ((hal_vp9d_debug & 1) != 0) {
    _mpp_log_l(4,"hal_vp9d_vdpu382","(%d) leave\n","hal_vp9d_vdpu382_reset",0x432);
  }
  return MPP_OK;
}

Assistant:

static MPP_RET hal_vp9d_vdpu382_reset(void *hal)
{
    HalVp9dCtx *p_hal = (HalVp9dCtx*)hal;
    Vdpu382Vp9dCtx *hw_ctx = (Vdpu382Vp9dCtx*)p_hal->hw_ctx;

    hal_vp9d_enter();

    memset(&hw_ctx->ls_info, 0, sizeof(hw_ctx->ls_info));
    hw_ctx->mv_base_addr = -1;
    hw_ctx->pre_mv_base_addr = -1;
    hw_ctx->last_segid_flag = 1;
    memset(&hw_ctx->prob_ref_poc, 0, sizeof(hw_ctx->prob_ref_poc));
    hw_ctx->col_ref_poc = 0;
    hw_ctx->segid_ref_poc = 0;

    hal_vp9d_leave();

    return MPP_OK;
}